

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairTools.cpp
# Opt level: O2

void __thiscall
wirehair::PeelRowParameters::Initialize
          (PeelRowParameters *this,uint32_t row_seed,uint32_t p_seed,uint16_t peel_column_count,
          uint16_t mix_column_count)

{
  ulong uVar1;
  ulong uVar2;
  ushort uVar3;
  uint16_t uVar4;
  byte bVar5;
  undefined6 in_register_0000000a;
  uint uVar6;
  uint uVar7;
  undefined6 in_register_00000082;
  ulong uVar8;
  
  uVar8 = (ulong)row_seed;
  uVar1 = ((ulong)p_seed + 1) * 0x5851f42d4c957f2d + uVar8 * -0x4f5c17a566d501a4 + 1;
  uVar2 = uVar1 * 0x5851f42d4c957f2d + 1 + uVar8 * 2;
  uVar6 = (uint)(uVar1 >> 0x2d) ^ (uint)(uVar1 >> 0x1b);
  bVar5 = (byte)(uVar1 >> 0x3b);
  uVar4 = GeneratePeelRowWeight(uVar6 >> bVar5 | uVar6 << 0x20 - bVar5,peel_column_count);
  uVar3 = (ushort)(CONCAT62(in_register_0000000a,peel_column_count) >> 1);
  if (uVar3 <= uVar4) {
    uVar4 = uVar3;
  }
  this->PeelCount = uVar4;
  uVar6 = (uint)(uVar2 >> 0x2d) ^ (uint)(uVar2 >> 0x1b);
  bVar5 = (byte)(uVar2 >> 0x3b);
  uVar6 = uVar6 >> bVar5 | uVar6 << 0x20 - bVar5;
  uVar1 = uVar2 * 0x5851f42d4c957f2d + 1 + uVar8 * 2;
  this->PeelAdd =
       (short)((long)(ulong)(uVar6 & 0xffff) %
              (long)((int)CONCAT62(in_register_0000000a,peel_column_count) + -1)) + 1;
  uVar7 = (uint)(uVar1 >> 0x2d) ^ (uint)(uVar1 >> 0x1b);
  bVar5 = (byte)(uVar1 >> 0x3b);
  this->PeelFirst = (uint16_t)((uVar6 >> 0x10) % (uint)peel_column_count);
  uVar6 = uVar7 >> bVar5 | uVar7 << 0x20 - bVar5;
  this->MixAdd = (short)((long)(ulong)(uVar6 & 0xffff) %
                        (long)((int)CONCAT62(in_register_00000082,mix_column_count) + -1)) + 1;
  this->MixFirst = (uint16_t)((uVar6 >> 0x10) % (uint)mix_column_count);
  return;
}

Assistant:

void PeelRowParameters::Initialize(
    uint32_t row_seed,
    uint32_t p_seed,
    uint16_t peel_column_count,
    uint16_t mix_column_count)
{
    // Initialize PRNG
    PCGRandom prng;
    prng.Seed(row_seed, p_seed);

    // Generate peeling matrix row weight
    const uint16_t weight = GeneratePeelRowWeight(prng.Next(), peel_column_count);

    // Do not set more than N/2 at a time
    const uint16_t max_weight = peel_column_count / 2;

    PeelCount = (weight > max_weight) ? max_weight : weight;

    CAT_DEBUG_ASSERT(PeelCount > 0 && PeelCount <= kMaxPeelCount);

    const uint32_t rv_peel = prng.Next();

    // Generate peeling matrix column selection parameters for row
    PeelAdd = ((uint16_t)rv_peel % (peel_column_count - 1)) + 1;
    PeelFirst = (uint16_t)(rv_peel >> 16) % peel_column_count;

    const uint32_t rv_mix = prng.Next();

    // Generate mixing matrix column selection parameters
    MixAdd = ((uint16_t)rv_mix % (mix_column_count - 1)) + 1;
    MixFirst = (uint16_t)(rv_mix >> 16) % mix_column_count;
}